

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
run_default_dispatcher_and_go_further
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
           *this,env_init_t *init_fn)

{
  anon_class_40_2_424c5504 local_88;
  anon_class_8_1_8991fb9c local_60;
  anon_class_8_1_8991fb9c local_58 [3];
  allocator local_39;
  string local_38 [32];
  env_init_t *local_18;
  env_init_t *init_fn_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  local_18 = init_fn;
  init_fn_local = (env_init_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"run_default_dispatcher",&local_39);
  local_88.this = this;
  local_60.this = this;
  local_58[0].this = this;
  std::function<void_()>::function(&local_88.init_fn,init_fn);
  so_5::impl::
  run_stage<so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_1_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_2_,so_5::env_infrastructures::simple_not_mtsafe::impl::env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::run_default_dispatcher_and_go_further(std::function<void()>)::_lambda()_3_>
            ((string *)local_38,local_58,&local_60,&local_88);
  run_default_dispatcher_and_go_further(std::function<void()>)::{lambda()#3}::~function
            ((_lambda___3_ *)&local_88);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_disp.set_data_sources_name_base( "DEFAULT" );
					m_default_disp.start( m_env );
				},
				[this] {
					m_default_disp.shutdown();
					m_default_disp.wait();
				},
				[this, init_fn] {
					run_user_supplied_init_and_do_main_loop( std::move(init_fn) );
				} );
	}